

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ez-rpc.c++
# Opt level: O1

Client __thiscall capnp::EzRpcClient::importCap(EzRpcClient *this,StringPtr name)

{
  char *pcVar1;
  PromiseNode *pPVar2;
  size_t sVar3;
  ArrayDisposer *pAVar4;
  ForkBranchBase *pFVar5;
  TaskSet *pTVar6;
  EventLoop *pEVar7;
  long in_RCX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *extraout_RDX_01;
  ClientHook *extraout_RDX_02;
  ClientHook *extraout_RDX_03;
  ExceptionOrValue *pEVar9;
  StringPtr name_00;
  Client CVar10;
  Own<capnp::ClientHook> OVar11;
  PropagateException local_a9;
  undefined1 local_a8 [8];
  PromiseNode *local_a0;
  _func_int **local_98;
  EventLoop *local_90;
  Promise<kj::Own<capnp::ClientHook>_> local_88;
  String local_78;
  ExceptionOrValue *local_60;
  ForkBranchBase *local_58;
  TaskSet *pTStack_50;
  ArrayDisposer *local_48;
  undefined8 local_40;
  undefined8 uStack_38;
  ClientHook *pCVar8;
  
  name_00.content.size_ = (char *)name.content.size_;
  pEVar9 = (ExceptionOrValue *)name.content.ptr;
  pcVar1 = (pEVar9->exception).ptr.field_1.value.ownFile.content.ptr;
  if (*(long *)(pcVar1 + 0x28) == 0) {
    kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_a8);
    kj::heapString(&local_78,name_00.content.size_,in_RCX - 1);
    pAVar4 = local_78.content.disposer;
    sVar3 = local_78.content.size_;
    pcVar1 = local_78.content.ptr;
    local_58 = (ForkBranchBase *)local_78.content.ptr;
    pTStack_50 = (TaskSet *)local_78.content.size_;
    local_48 = local_78.content.disposer;
    local_78.content.ptr = (char *)0x0;
    local_78.content.size_ = 0;
    local_60 = pEVar9;
    pEVar7 = (EventLoop *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              ((TransformPromiseNodeBase *)pEVar7,(Own<kj::_::PromiseNode> *)local_a8,
               kj::
               CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/ez-rpc.c++:181:9),_kj::String>
               ::operator()<>);
    ((PromiseNode *)&pEVar7->port)->_vptr_PromiseNode = (_func_int **)&PTR_onReady_00647d78;
    pEVar7->depthFirstInsertPoint = (Event **)pEVar9;
    (pEVar7->daemons).disposer = (Disposer *)pcVar1;
    (pEVar7->daemons).ptr = (TaskSet *)sVar3;
    pEVar7[1].port = (EventPort *)pAVar4;
    local_58 = (ForkBranchBase *)0x0;
    pTStack_50 = (TaskSet *)0x0;
    local_98 = (_func_int **)
               &kj::_::
                HeapDisposer<kj::_::TransformPromiseNode<capnp::Capability::Client,kj::_::Void,kj::CaptureByMove<capnp::EzRpcClient::importCap(kj::StringPtr)::$_0,kj::String>,kj::_::PropagateException>>
                ::instance;
    local_90 = pEVar7;
    kj::
    heap<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,capnp::Capability::Client,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_,kj::_::PropagateException>,kj::Own<kj::_::PromiseNode>,capnp::Capability::Client::Client<capnp::Capability::Client,void>(kj::Promise<capnp::Capability::Client>&&)::_lambda(capnp::Capability::Client&&)_1_,kj::_::PropagateException>
              ((Own<kj::_::PromiseNode> *)&stack0xffffffffffffffc0,
               (anon_class_1_0_00000001_for_func *)&local_98,&local_a9);
    local_88.super_PromiseBase.node.disposer = (Disposer *)local_40;
    local_88.super_PromiseBase.node.ptr = (PromiseNode *)uStack_38;
    OVar11 = newLocalPromiseClient((capnp *)this,&local_88);
    pPVar2 = local_88.super_PromiseBase.node.ptr;
    pCVar8 = OVar11.ptr;
    if (local_88.super_PromiseBase.node.ptr != (PromiseNode *)0x0) {
      local_88.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
      (**(local_88.super_PromiseBase.node.disposer)->_vptr_Disposer)
                (local_88.super_PromiseBase.node.disposer,
                 (long)&pPVar2->_vptr_PromiseNode +
                 (long)((Event *)pPVar2->_vptr_PromiseNode)[-1].prev);
      pCVar8 = extraout_RDX;
    }
    pEVar7 = local_90;
    if (local_90 != (EventLoop *)0x0) {
      local_90 = (EventLoop *)0x0;
      (**(code **)*local_98)
                (local_98,((PromiseNode *)&pEVar7->port)->_vptr_PromiseNode[-2] +
                          (long)&((PromiseNode *)&pEVar7->port)->_vptr_PromiseNode);
      pCVar8 = extraout_RDX_00;
    }
    pTVar6 = pTStack_50;
    pFVar5 = local_58;
    if (local_58 != (ForkBranchBase *)0x0) {
      local_58 = (ForkBranchBase *)0x0;
      pTStack_50 = (TaskSet *)0x0;
      (**pAVar4->_vptr_ArrayDisposer)(pAVar4,pFVar5,1,pTVar6,pTVar6,0);
      pCVar8 = extraout_RDX_01;
    }
    sVar3 = local_78.content.size_;
    pcVar1 = local_78.content.ptr;
    if (local_78.content.ptr != (char *)0x0) {
      local_78.content.ptr = (char *)0x0;
      local_78.content.size_ = 0;
      (**(local_78.content.disposer)->_vptr_ArrayDisposer)
                (local_78.content.disposer,pcVar1,1,sVar3,sVar3,0);
      pCVar8 = extraout_RDX_02;
    }
    pPVar2 = local_a0;
    if (local_a0 != (PromiseNode *)0x0) {
      local_a0 = (PromiseNode *)0x0;
      (**(code **)*(_func_int **)local_a8)
                (local_a8,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode);
      pCVar8 = extraout_RDX_03;
    }
  }
  else {
    name_00.content.ptr = *(char **)(pcVar1 + 0x28);
    CVar10 = Impl::ClientContext::restore((ClientContext *)this,name_00);
    pCVar8 = CVar10.hook.ptr;
  }
  CVar10.hook.ptr = pCVar8;
  CVar10.hook.disposer = (Disposer *)this;
  return (Client)CVar10.hook;
}

Assistant:

Capability::Client EzRpcClient::importCap(kj::StringPtr name) {
  KJ_IF_MAYBE(client, impl->clientContext) {
    return client->get()->restore(name);
  } else {
    return impl->setupPromise.addBranch().then(kj::mvCapture(kj::heapString(name),
        [this](kj::String&& name) {
      return KJ_ASSERT_NONNULL(impl->clientContext)->restore(name);
    }));
  }
}